

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::ZipWriter::Write(ZipWriter *this,string *filename,string *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  uint8 p [2];
  CodedOutputStream output;
  FileInfo info;
  undefined2 local_7a;
  CodedOutputStream local_78;
  value_type local_58;
  
  paVar1 = &local_58.name.field_2;
  local_58.name._M_string_length = 0;
  local_58.name.field_2._M_local_buf[0] = '\0';
  local_58.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_assign((string *)&local_58);
  sVar2 = filename->_M_string_length;
  local_58.offset = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  sVar3 = contents->_M_string_length;
  local_58.size = (uint32)sVar3;
  if (sVar3 == 0) {
    local_58.crc32 = 0;
  }
  else {
    local_58.crc32 = 0xffffffff;
    sVar4 = 0;
    do {
      local_58.crc32 =
           local_58.crc32 >> 8 ^
           *(uint *)(kCRC32Table +
                    (ulong)(byte)((contents->_M_dataplus)._M_p[sVar4] ^ (byte)local_58.crc32) * 4);
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
    local_58.crc32 = ~local_58.crc32;
  }
  std::
  vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
  ::push_back(&this->files_,&local_58);
  io::CodedOutputStream::CodedOutputStream(&local_78,this->raw_output_);
  io::CodedOutputStream::WriteLittleEndian32(&local_78,0x4034b50);
  local_7a = 10;
  io::CodedOutputStream::WriteRaw(&local_78,&local_7a,2);
  local_7a = 0;
  io::CodedOutputStream::WriteRaw(&local_78,&local_7a,2);
  local_7a = 0;
  io::CodedOutputStream::WriteRaw(&local_78,&local_7a,2);
  local_7a = 0;
  io::CodedOutputStream::WriteRaw(&local_78,&local_7a,2);
  local_7a = 0;
  io::CodedOutputStream::WriteRaw(&local_78,&local_7a,2);
  io::CodedOutputStream::WriteLittleEndian32(&local_78,local_58.crc32);
  io::CodedOutputStream::WriteLittleEndian32(&local_78,local_58.size);
  io::CodedOutputStream::WriteLittleEndian32(&local_78,local_58.size);
  local_7a = (undefined2)sVar2;
  io::CodedOutputStream::WriteRaw(&local_78,&local_7a,2);
  local_7a = 0;
  io::CodedOutputStream::WriteRaw(&local_78,&local_7a,2);
  io::CodedOutputStream::WriteRaw
            (&local_78,(filename->_M_dataplus)._M_p,(int)filename->_M_string_length);
  io::CodedOutputStream::WriteRaw
            (&local_78,(contents->_M_dataplus)._M_p,(int)contents->_M_string_length);
  io::CodedOutputStream::~CodedOutputStream(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.name._M_dataplus._M_p,
                    CONCAT71(local_58.name.field_2._M_allocated_capacity._1_7_,
                             local_58.name.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(local_78.had_error_ ^ 1);
}

Assistant:

bool ZipWriter::Write(const string& filename, const string& contents) {
  FileInfo info;

  info.name = filename;
  uint16 filename_size = filename.size();
  info.offset = raw_output_->ByteCount();
  info.size = contents.size();
  info.crc32 = ComputeCRC32(contents);

  files_.push_back(info);

  // write file header
  io::CodedOutputStream output(raw_output_);
  output.WriteLittleEndian32(0x04034b50);  // magic
  WriteShort(&output, 10);  // version needed to extract
  WriteShort(&output, 0);  // flags
  WriteShort(&output, 0);  // compression method: stored
  WriteShort(&output, 0);  // last modified time
  WriteShort(&output, 0);  // last modified date
  output.WriteLittleEndian32(info.crc32);  // crc-32
  output.WriteLittleEndian32(info.size);  // compressed size
  output.WriteLittleEndian32(info.size);  // uncompressed size
  WriteShort(&output, filename_size);  // file name length
  WriteShort(&output, 0);   // extra field length
  output.WriteString(filename);  // file name
  output.WriteString(contents);  // file data

  return !output.HadError();
}